

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

int rlGetLocationUniform(uint shaderId,char *uniformName)

{
  uint uVar1;
  int location;
  char *uniformName_local;
  uint shaderId_local;
  
  uVar1 = (*glad_glGetUniformLocation)(shaderId,uniformName);
  if (uVar1 == 0xffffffff) {
    TraceLog(4,"SHADER: [ID %i] Failed to find shader uniform: %s",(ulong)shaderId,uniformName);
  }
  else {
    TraceLog(3,"SHADER: [ID %i] Shader uniform (%s) set at location: %i",(ulong)shaderId,uniformName
             ,(ulong)uVar1);
  }
  return uVar1;
}

Assistant:

int rlGetLocationUniform(unsigned int shaderId, const char *uniformName)
{
    int location = -1;
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    location = glGetUniformLocation(shaderId, uniformName);

    if (location == -1) TRACELOG(LOG_WARNING, "SHADER: [ID %i] Failed to find shader uniform: %s", shaderId, uniformName);
    else TRACELOG(LOG_INFO, "SHADER: [ID %i] Shader uniform (%s) set at location: %i", shaderId, uniformName, location);
#endif
    return location;
}